

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubFodderBuilders.cpp
# Opt level: O0

void __thiscall SubFodderBuilderB::addIngredientA(SubFodderBuilderB *this)

{
  Fodder *this_00;
  allocator local_31;
  string local_30 [32];
  SubFodderBuilderB *local_10;
  SubFodderBuilderB *this_local;
  
  this_00 = this->_fodder;
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"BA",&local_31);
  Fodder::setIngredientA(this_00,(string *)local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return;
}

Assistant:

void SubFodderBuilderB::addIngredientA() {
	// add something
	_fodder->setIngredientA("BA");
}